

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::HasItem(RecyclableObject *object,uint32 index)

{
  BOOL BVar1;
  PropertyQueryFlags val;
  PropertyQueryFlags result;
  uint32 index_local;
  RecyclableObject *object_local;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(object);
  _result = object;
  while( true ) {
    BVar1 = IsNull(_result);
    if (BVar1 != 0) {
      return 0;
    }
    val = (*(_result->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x24])(_result,(ulong)index);
    if (val != Property_NotFound) break;
    _result = GetPrototypeNoTrap(_result);
  }
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::HasItem(RecyclableObject* object, uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(object);
#endif
        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result;
            if ((result = object->HasItemQuery(index)) != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result);
            }
            // CONSIDER: Numeric property values shouldn't be on the prototype for now but if this changes
            // we should add SkipsPrototype support here as well
            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }
        return false;
    }